

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

PktOut * ssh2_chanopen_init(ssh2_channel *c,char *type)

{
  BinarySink *bs;
  PktOut *pPVar1;
  
  pPVar1 = (*((c->connlayer->ppl).bpp)->vt->new_pktout)(0x5a);
  bs = pPVar1->binarysink_;
  BinarySink_put_stringz(bs,type);
  BinarySink_put_uint32(bs,(ulong)c->localid);
  BinarySink_put_uint32(bs,(long)c->locwindow);
  BinarySink_put_uint32(bs,0x4000);
  return pPVar1;
}

Assistant:

PktOut *ssh2_chanopen_init(struct ssh2_channel *c, const char *type)
{
    struct ssh2_connection_state *s = c->connlayer;
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_CHANNEL_OPEN);
    put_stringz(pktout, type);
    put_uint32(pktout, c->localid);
    put_uint32(pktout, c->locwindow);     /* our window size */
    put_uint32(pktout, OUR_V2_MAXPKT);    /* our max pkt size */
    return pktout;
}